

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simulator.cpp
# Opt level: O3

void __thiscall lsim::Simulator::clear_nodes(Simulator *this)

{
  pointer puVar1;
  pointer pVVar2;
  pointer puVar3;
  
  puVar1 = (this->m_free_nodes).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((this->m_free_nodes).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish != puVar1) {
    (this->m_free_nodes).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar1;
  }
  pVVar2 = (this->m_node_values_read).super__Vector_base<lsim::Value,_std::allocator<lsim::Value>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((this->m_node_values_read).super__Vector_base<lsim::Value,_std::allocator<lsim::Value>_>.
      _M_impl.super__Vector_impl_data._M_finish != pVVar2) {
    (this->m_node_values_read).super__Vector_base<lsim::Value,_std::allocator<lsim::Value>_>._M_impl
    .super__Vector_impl_data._M_finish = pVVar2;
  }
  pVVar2 = (this->m_node_values_write).super__Vector_base<lsim::Value,_std::allocator<lsim::Value>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->m_node_values_write).super__Vector_base<lsim::Value,_std::allocator<lsim::Value>_>.
      _M_impl.super__Vector_impl_data._M_finish != pVVar2) {
    (this->m_node_values_write).super__Vector_base<lsim::Value,_std::allocator<lsim::Value>_>.
    _M_impl.super__Vector_impl_data._M_finish = pVVar2;
  }
  std::vector<lsim::NodeMetadata,_std::allocator<lsim::NodeMetadata>_>::_M_erase_at_end
            (&this->m_node_metadata,
             (this->m_node_metadata).
             super__Vector_base<lsim::NodeMetadata,_std::allocator<lsim::NodeMetadata>_>._M_impl.
             super__Vector_impl_data._M_start);
  puVar1 = (this->m_dirty_nodes_read).
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->m_dirty_nodes_read).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_finish != puVar1) {
    (this->m_dirty_nodes_read).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
    _M_impl.super__Vector_impl_data._M_finish = puVar1;
  }
  puVar1 = (this->m_dirty_nodes_write).
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->m_dirty_nodes_write).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_finish != puVar1) {
    (this->m_dirty_nodes_write).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
    _M_impl.super__Vector_impl_data._M_finish = puVar1;
  }
  puVar3 = (this->m_node_write_time).
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->m_node_write_time).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
      _M_impl.super__Vector_impl_data._M_finish != puVar3) {
    (this->m_node_write_time).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
    _M_impl.super__Vector_impl_data._M_finish = puVar3;
  }
  puVar3 = (this->m_node_change_time).
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->m_node_change_time).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
      _M_impl.super__Vector_impl_data._M_finish != puVar3) {
    (this->m_node_change_time).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
    _M_impl.super__Vector_impl_data._M_finish = puVar3;
  }
  return;
}

Assistant:

void Simulator::clear_nodes() {
    m_free_nodes.clear();
    m_node_values_read.clear();
    m_node_values_write.clear();
    m_node_metadata.clear();
    m_dirty_nodes_read.clear();
    m_dirty_nodes_write.clear();
    m_node_write_time.clear();
    m_node_change_time.clear();
}